

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileSet.cxx
# Opt level: O2

static_string_view cmFileSetVisibilityToName(cmFileSetVisibility vis)

{
  char *pcVar1;
  static_string_view sVar2;
  size_t sStack_8;
  
  if (vis == Private) {
    pcVar1 = "PRIVATE";
    sStack_8 = 7;
  }
  else if (vis == Interface) {
    pcVar1 = "INTERFACE";
    sStack_8 = 9;
  }
  else {
    if (vis != Public) {
      return (string_view)(ZEXT816(0x61ebb9) << 0x40);
    }
    pcVar1 = "PUBLIC";
    sStack_8 = 6;
  }
  sVar2.super_string_view._M_str = pcVar1;
  sVar2.super_string_view._M_len = sStack_8;
  return (static_string_view)sVar2.super_string_view;
}

Assistant:

cm::static_string_view cmFileSetVisibilityToName(cmFileSetVisibility vis)
{
  switch (vis) {
    case cmFileSetVisibility::Interface:
      return "INTERFACE"_s;
    case cmFileSetVisibility::Public:
      return "PUBLIC"_s;
    case cmFileSetVisibility::Private:
      return "PRIVATE"_s;
  }
  return ""_s;
}